

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::throw_or_mimic<cxxopts::invalid_option_format_error>(string *text)

{
  undefined8 uVar1;
  string *in_stack_00000058;
  invalid_option_format_error *in_stack_00000060;
  
  uVar1 = __cxa_allocate_exception(0x28);
  invalid_option_format_error::invalid_option_format_error(in_stack_00000060,in_stack_00000058);
  __cxa_throw(uVar1,&invalid_option_format_error::typeinfo,
              invalid_option_format_error::~invalid_option_format_error);
}

Assistant:

void throw_or_mimic(const std::string& text)
  {
    static_assert(std::is_base_of<std::exception, T>::value,
                  "throw_or_mimic only works on std::exception and "
                  "deriving classes");

#ifndef CXXOPTS_NO_EXCEPTIONS
    // If CXXOPTS_NO_EXCEPTIONS is not defined, just throw
    throw T{text};
#else
    // Otherwise manually instantiate the exception, print what() to stderr,
    // and exit
    T exception{text};
    std::cerr << exception.what() << std::endl;
    std::exit(EXIT_FAILURE);
#endif
  }